

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O1

void nhdp_domain_init_l2hop(nhdp_l2hop *l2hop)

{
  int iVar1;
  list_entity **pplVar2;
  long lVar3;
  list_entity *plVar4;
  
  lVar3 = 0;
  do {
    *(undefined8 *)((long)&l2hop->_domaindata[0].metric.in + lVar3) = 0xffffff00ffffff;
    lVar3 = lVar3 + 0xc;
  } while (lVar3 != 0x30);
  plVar4 = _domain_list.next;
  if ((_domain_list.next)->prev != _domain_list.prev) {
    do {
      if (*(char *)&plVar4[-0x28].next[2].next == '\x01') {
        iVar1 = *(int *)((long)&plVar4[-0x27].next + 4);
        l2hop->_domaindata[iVar1].metric.in = *(uint32_t *)&plVar4[-0x28].next[1].prev;
        l2hop->_domaindata[iVar1].metric.out = *(uint32_t *)((long)&plVar4[-0x28].next[1].prev + 4);
      }
      pplVar2 = &plVar4->next;
      plVar4 = *pplVar2;
    } while ((*pplVar2)->prev != _domain_list.prev);
  }
  return;
}

Assistant:

void
nhdp_domain_init_l2hop(struct nhdp_l2hop *l2hop) {
  struct nhdp_domain *domain;
  struct nhdp_l2hop_domaindata *data;
  int i;

  /* initialize metrics */
  for (i = 0; i < NHDP_MAXIMUM_DOMAINS; i++) {
    l2hop->_domaindata[i].metric.in = RFC7181_METRIC_INFINITE;
    l2hop->_domaindata[i].metric.out = RFC7181_METRIC_INFINITE;
  }

  list_for_each_element(&_domain_list, domain, _node) {
    data = nhdp_domain_get_l2hopdata(domain, l2hop);

    if (domain->metric->no_default_handling) {
      data->metric.in = domain->metric->incoming_2hop_start;
      data->metric.out = domain->metric->outgoing_2hop_start;
    }
  }
}